

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadeVertices
          (VertexVaryingShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int iVar1;
  VertexPacket *pVVar2;
  ulong uVar3;
  ulong uVar4;
  Vec4 color;
  int local_78;
  int iStack_74;
  float fStack_70;
  float fStack_6c;
  Vector<float,_4> local_68;
  ulong local_50;
  Vector<float,_4> local_48;
  
  if (*(int *)&(this->super_ShaderProgram).field_0x154 != -1) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)numPackets;
    local_50 = (ulong)(uint)numPackets;
    if (numPackets < 1) {
      uVar3 = uVar4;
      local_50 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      rr::readVertexAttribFloat
                ((rr *)&local_68,inputs + 1,packets[uVar4]->instanceNdx,packets[uVar4]->vertexNdx);
      rr::readVertexAttribFloat
                ((rr *)&local_78,inputs,packets[uVar4]->instanceNdx,packets[uVar4]->vertexNdx);
      pVVar2 = packets[uVar4];
      *(ulong *)(pVVar2->position).m_data = CONCAT44(iStack_74,local_78);
      *(ulong *)((pVVar2->position).m_data + 2) = CONCAT44(fStack_6c,fStack_70);
      pVVar2 = packets[uVar4];
      pVVar2->pointSize = 1.0;
      iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
      if (iVar1 == 2) {
        tcu::operator*((tcu *)&local_78,0.5,&local_68);
        uVar3 = local_50;
        pVVar2 = packets[uVar4];
        *(ulong *)&pVVar2->outputs[0].v = CONCAT44(iStack_74,local_78);
        *(ulong *)((long)&pVVar2->outputs[0].v + 8) = CONCAT44(fStack_6c,fStack_70);
        local_48.m_data[0] = local_68.m_data[2];
        local_48.m_data[1] = local_68.m_data[1];
        local_48.m_data[2] = local_68.m_data[0];
        local_48.m_data[3] = local_68.m_data[3];
        tcu::operator*((tcu *)&local_78,0.5,&local_48);
        pVVar2 = packets[uVar4];
        pVVar2[1].instanceNdx = local_78;
        pVVar2[1].vertexNdx = iStack_74;
        pVVar2[1].position.m_data[0] = fStack_70;
        pVVar2[1].position.m_data[1] = fStack_6c;
      }
      else if (iVar1 == 1) {
        *(ulong *)&pVVar2->outputs[0].v = CONCAT44(local_68.m_data[1],local_68.m_data[0]);
        *(ulong *)((long)&pVVar2->outputs[0].v + 8) =
             CONCAT44(local_68.m_data[3],local_68.m_data[2]);
      }
    }
  }
  return;
}

Assistant:

void VertexVaryingShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	// vertex shader is no-op
	if (m_vertexOut == -1)
		return;

	for (int ndx = 0; ndx < numPackets; ++ndx)
	{
		const tcu::Vec4 color = rr::readVertexAttribFloat(inputs[1], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);

		packets[ndx]->position = rr::readVertexAttribFloat(inputs[0], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
		packets[ndx]->pointSize = 1.0f;

		switch (m_vertexOut)
		{
			case 0:
				break;

			case 1:
				packets[ndx]->outputs[0] = color;
				break;

			case 2:
				packets[ndx]->outputs[0] = color * 0.5f;
				packets[ndx]->outputs[1] = color.swizzle(2,1,0,3) * 0.5f;
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}